

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

void absl::lts_20240722::container_internal::DeallocateStandard<8ul>
               (CommonFields *common,PolicyFunctions *policy)

{
  size_t sVar1;
  void *p;
  allocator<char> alloc;
  RawHashSetLayout local_38;
  
  if ((common->size_ & 1) != 0) {
    CommonFields::backing_array_start(common);
  }
  p = CommonFields::backing_array_start(common);
  sVar1 = policy->slot_size;
  RawHashSetLayout::RawHashSetLayout
            (&local_38,common->capacity_,8,(bool)((byte)(int)common->size_ & 1));
  Deallocate<8ul,std::allocator<char>>
            ((allocator<char> *)&local_38,p,sVar1 * local_38.capacity_ + local_38.slot_offset_);
  return;
}

Assistant:

ABSL_ATTRIBUTE_NOINLINE void DeallocateStandard(CommonFields& common,
                                                const PolicyFunctions& policy) {
  // Unpoison before returning the memory to the allocator.
  SanitizerUnpoisonMemoryRegion(common.slot_array(),
                                policy.slot_size * common.capacity());

  std::allocator<char> alloc;
  common.infoz().Unregister();
  Deallocate<BackingArrayAlignment(AlignOfSlot)>(
      &alloc, common.backing_array_start(),
      common.alloc_size(policy.slot_size, AlignOfSlot));
}